

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_notif(lysp_yang_ctx *ctx,lysp_node *parent,lysp_node_notif **notifs)

{
  lysp_node_notif *plVar1;
  LY_ERR LVar2;
  lysp_node_notif *parent_00;
  char *pcVar3;
  ly_ctx *local_110;
  ly_ctx *local_108;
  ly_ctx *local_100;
  ly_ctx *local_e8;
  char *local_e0;
  ly_ctx *local_d0;
  ly_ctx *local_c8;
  ly_ctx *local_c0;
  LY_ERR ret___15;
  LY_ERR ret___14;
  LY_ERR ret___13;
  LY_ERR ret___12;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  ly_bool __loop_end;
  long *plStack_70;
  LY_ERR ret__;
  char **iter__;
  size_t offset__;
  char *p__;
  lysp_node_notif *notif;
  size_t sStack_48;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_node_notif **pplStack_28;
  LY_ERR ret;
  lysp_node_notif **notifs_local;
  lysp_node *parent_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  pplStack_28 = notifs;
  notifs_local = (lysp_node_notif **)parent;
  parent_local = (lysp_node *)ctx;
  parent_00 = (lysp_node_notif *)calloc(1,0x60);
  if (parent_00 == (lysp_node_notif *)0x0) {
    if (parent_local == (lysp_node *)0x0) {
      local_c0 = (ly_ctx *)0x0;
    }
    else {
      local_c0 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    ly_log(local_c0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_notif");
    return LY_EMEM;
  }
  if (*pplStack_28 == (lysp_node_notif *)0x0) {
    *pplStack_28 = parent_00;
  }
  else {
    plVar1 = *pplStack_28;
    while (plStack_70 = (long *)((long)plVar1 + (long)*pplStack_28 + (0x10 - (long)*pplStack_28)),
          *plStack_70 != 0) {
      plVar1 = (lysp_node_notif *)*plStack_70;
    }
    *plStack_70 = (long)parent_00;
  }
  LVar2 = get_argument((lysp_yang_ctx *)parent_local,Y_IDENTIF_ARG,(uint16_t *)0x0,
                       (char **)&word_len,&word,&stack0xffffffffffffffb8);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if (word == (char *)0x0) {
    if (parent_local == (lysp_node *)0x0) {
      local_d0 = (ly_ctx *)0x0;
    }
    else {
      local_d0 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    if (sStack_48 == 0) {
      local_e0 = "";
    }
    else {
      local_e0 = (char *)word_len;
    }
    buf._4_4_ = lydict_insert(local_d0,local_e0,sStack_48,&(parent_00->field_0).node.name);
  }
  else {
    if (parent_local == (lysp_node *)0x0) {
      local_c8 = (ly_ctx *)0x0;
    }
    else {
      local_c8 = *(ly_ctx **)
                  **(undefined8 **)
                    (parent_local->exts->argument +
                    (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
    }
    buf._4_4_ = lydict_insert_zc(local_c8,(char *)word_len,&(parent_00->field_0).node.name);
  }
  if (buf._4_4_ == LY_SUCCESS) {
    buf._4_4_ = 0;
    (parent_00->field_0).node.nodetype = 0x400;
    (parent_00->field_0).node.parent = (lysp_node *)notifs_local;
    buf._4_4_ = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&notif + 4),
                            (char **)&word_len,&stack0xffffffffffffffb8);
    if (buf._4_4_ == LY_SUCCESS) {
      if (notif._4_4_ == LY_STMT_SYNTAX_SEMICOLON) {
        ret___2._3_1_ = 1;
        LVar2 = buf._4_4_;
      }
      else {
        if (notif._4_4_ != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (parent_local == (lysp_node *)0x0) {
            local_e8 = (ly_ctx *)0x0;
          }
          else {
            local_e8 = *(ly_ctx **)
                        **(undefined8 **)
                          (parent_local->exts->argument +
                          (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
          }
          pcVar3 = lyplg_ext_stmt2str(notif._4_4_);
          ly_vlog(local_e8,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar3);
          return LY_EVALID;
        }
        LVar2 = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&notif + 4),
                            (char **)&word_len,&stack0xffffffffffffffb8);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        ret___2._3_1_ = notif._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE;
        LVar2 = LY_SUCCESS;
      }
      while (buf._4_4_ = LVar2, !(bool)ret___2._3_1_) {
        if (notif._4_4_ == LY_STMT_ANYDATA) {
          if (*(byte *)(*(long *)(parent_local->exts->argument +
                                 (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8) +
                       0x78) < 2) {
            if (parent_local == (lysp_node *)0x0) {
              local_100 = (ly_ctx *)0x0;
            }
            else {
              local_100 = *(ly_ctx **)
                           **(undefined8 **)
                             (parent_local->exts->argument +
                             (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
            }
            ly_vlog(local_100,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ,"anydata","notification");
            return LY_EVALID;
          }
LAB_001c4b3a:
          LVar2 = parse_any((lysp_yang_ctx *)parent_local,notif._4_4_,(lysp_node *)parent_00,
                            &parent_00->child);
        }
        else {
          if (notif._4_4_ == LY_STMT_ANYXML) goto LAB_001c4b3a;
          if (notif._4_4_ == LY_STMT_CHOICE) {
            LVar2 = parse_choice((lysp_yang_ctx *)parent_local,(lysp_node *)parent_00,
                                 &parent_00->child);
          }
          else if (notif._4_4_ == LY_STMT_CONTAINER) {
            LVar2 = parse_container((lysp_yang_ctx *)parent_local,(lysp_node *)parent_00,
                                    &parent_00->child);
          }
          else if (notif._4_4_ == LY_STMT_GROUPING) {
            LVar2 = parse_grouping((lysp_yang_ctx *)parent_local,(lysp_node *)parent_00,
                                   &parent_00->groupings);
          }
          else if (notif._4_4_ == LY_STMT_LEAF) {
            LVar2 = parse_leaf((lysp_yang_ctx *)parent_local,(lysp_node *)parent_00,
                               &parent_00->child);
          }
          else if (notif._4_4_ == LY_STMT_LEAF_LIST) {
            LVar2 = parse_leaflist((lysp_yang_ctx *)parent_local,(lysp_node *)parent_00,
                                   &parent_00->child);
          }
          else if (notif._4_4_ == LY_STMT_LIST) {
            LVar2 = parse_list((lysp_yang_ctx *)parent_local,(lysp_node *)parent_00,
                               &parent_00->child);
          }
          else if (notif._4_4_ == LY_STMT_USES) {
            LVar2 = parse_uses((lysp_yang_ctx *)parent_local,(lysp_node *)parent_00,
                               &parent_00->child);
          }
          else if (notif._4_4_ == LY_STMT_DESCRIPTION) {
            LVar2 = parse_text_field((lysp_yang_ctx *)parent_local,(parent_00->field_0).node.dsc,
                                     LY_STMT_DESCRIPTION,0,&(parent_00->field_0).node.dsc,Y_STR_ARG,
                                     (uint16_t *)0x0,&(parent_00->field_0).node.exts);
          }
          else if (notif._4_4_ == LY_STMT_EXTENSION_INSTANCE) {
            LVar2 = parse_ext((lysp_yang_ctx *)parent_local,(char *)word_len,sStack_48,parent_00,
                              LY_STMT_NOTIFICATION,0,&(parent_00->field_0).node.exts);
          }
          else if (notif._4_4_ == LY_STMT_IF_FEATURE) {
            LVar2 = parse_qnames((lysp_yang_ctx *)parent_local,LY_STMT_IF_FEATURE,
                                 &(parent_00->field_0).node.iffeatures,Y_STR_ARG,
                                 &(parent_00->field_0).node.exts);
          }
          else if (notif._4_4_ == LY_STMT_MUST) {
            if (*(byte *)(*(long *)(parent_local->exts->argument +
                                   (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8) +
                         0x78) < 2) {
              if (parent_local == (lysp_node *)0x0) {
                local_108 = (ly_ctx *)0x0;
              }
              else {
                local_108 = *(ly_ctx **)
                             **(undefined8 **)
                               (parent_local->exts->argument +
                               (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
              }
              ly_vlog(local_108,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ,"must","notification");
              return LY_EVALID;
            }
            LVar2 = parse_restrs((lysp_yang_ctx *)parent_local,LY_STMT_MUST,&parent_00->musts);
          }
          else if (notif._4_4_ == LY_STMT_REFERENCE) {
            LVar2 = parse_text_field((lysp_yang_ctx *)parent_local,(parent_00->field_0).node.ref,
                                     LY_STMT_REFERENCE,0,&(parent_00->field_0).node.ref,Y_STR_ARG,
                                     (uint16_t *)0x0,&(parent_00->field_0).node.exts);
          }
          else if (notif._4_4_ == LY_STMT_STATUS) {
            LVar2 = parse_status((lysp_yang_ctx *)parent_local,&(parent_00->field_0).node.flags,
                                 &(parent_00->field_0).node.exts);
          }
          else {
            if (notif._4_4_ != LY_STMT_TYPEDEF) {
              if (parent_local == (lysp_node *)0x0) {
                local_110 = (ly_ctx *)0x0;
              }
              else {
                local_110 = *(ly_ctx **)
                             **(undefined8 **)
                               (parent_local->exts->argument +
                               (ulong)(*(int *)((long)&parent_local->exts->name + 4) - 1) * 8);
              }
              pcVar3 = lyplg_ext_stmt2str(notif._4_4_);
              ly_vlog(local_110,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,"notification");
              return LY_EVALID;
            }
            LVar2 = parse_typedef((lysp_yang_ctx *)parent_local,(lysp_node *)parent_00,
                                  &parent_00->typedefs);
          }
        }
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        buf._4_4_ = get_keyword((lysp_yang_ctx *)parent_local,(ly_stmt *)((long)&notif + 4),
                                (char **)&word_len,&stack0xffffffffffffffb8);
        if (buf._4_4_ != LY_SUCCESS) {
          return buf._4_4_;
        }
        LVar2 = LY_SUCCESS;
        if (notif._4_4_ == LY_STMT_SYNTAX_RIGHT_BRACE) {
          if (((parent_00->field_0).node.exts != (lysp_ext_instance *)0x0) &&
             (LVar2 = ly_set_add((ly_set *)&(parent_local[1].parent)->ref,
                                 (parent_00->field_0).node.exts,'\x01',(uint32_t *)0x0),
             LVar2 != LY_SUCCESS)) {
            return LVar2;
          }
          buf._4_4_ = LVar2;
          ret___2._3_1_ = true;
          LVar2 = buf._4_4_;
        }
      }
    }
  }
  return buf._4_4_;
}

Assistant:

LY_ERR
parse_notif(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_node_notif **notifs)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_node_notif *notif;

    LY_LIST_NEW_RET(PARSER_CTX(ctx), notifs, notif, next, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, notif->name, word, word_len, ret, cleanup);
    notif->nodetype = LYS_NOTIF;
    notif->parent = parent;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, notif->dsc, LY_STMT_DESCRIPTION, 0, &notif->dsc, Y_STR_ARG, NULL,
                    &notif->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &notif->iffeatures, Y_STR_ARG, &notif->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, notif->ref, LY_STMT_REFERENCE, 0, &notif->ref, Y_STR_ARG, NULL,
                    &notif->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &notif->flags, &notif->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "notification");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, (struct lysp_node *)notif, &notif->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, (struct lysp_node *)notif, &notif->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, (struct lysp_node *)notif, &notif->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, (struct lysp_node *)notif, &notif->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, (struct lysp_node *)notif, &notif->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, (struct lysp_node *)notif, &notif->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, (struct lysp_node *)notif, &notif->child));
            break;

        case LY_STMT_MUST:
            PARSER_CHECK_STMTVER2_RET(ctx, "must", "notification");
            LY_CHECK_RET(parse_restrs(ctx, kw, &notif->musts));
            break;
        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, (struct lysp_node *)notif, &notif->typedefs));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, (struct lysp_node *)notif, &notif->groupings));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, notif, LY_STMT_NOTIFICATION, 0, &notif->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "notification");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, notif->exts, ret, cleanup);
    }

cleanup:
    return ret;
}